

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TimestampTestInstance *this)

{
  deUint32 dVar1;
  deUint64 *pdVar2;
  VkResult VVar3;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  VkQueue pVVar6;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  TestStatus *pTVar10;
  allocator<char> local_c1;
  TestStatus *local_c0;
  VkDevice local_b8;
  string local_b0;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> queueProperties;
  VkSubmitInfo submitInfo;
  
  local_c0 = __return_storage_ptr__;
  pDVar4 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar6 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  VVar3 = (*pDVar4->_vptr_DeviceInterface[0x14])(pDVar4,pVVar5,1,&this->m_fence);
  ::vk::checkResult(VVar3,"vk.resetFences(vkDevice, 1u, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x301);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&this->m_cmdBuffer;
  VVar3 = (*pDVar4->_vptr_DeviceInterface[2])
                    (pDVar4,pVVar6,1,&submitInfo,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1u, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x30f);
  uVar9 = 0xffffffffffffffff;
  local_b8 = pVVar5;
  VVar3 = (*pDVar4->_vptr_DeviceInterface[0x16])
                    (pDVar4,pVVar5,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar3,"vk.waitForFences(vkDevice, 1u, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x311);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceQueueFamilyProperties(&queueProperties,vk,physicalDevice);
  dVar1 = (queueProperties.
           super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
           ._M_impl.super__Vector_impl_data._M_start)->timestampValidBits;
  if (dVar1 != 0x40) {
    if (dVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Device does not support timestamp!",&local_c1);
      pTVar10 = local_c0;
      tcu::TestStatus::fail(local_c0,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_004df23d;
    }
    uVar9 = ~(-1L << ((byte)dVar1 & 0x3f));
  }
  uVar7 = (long)(this->m_stages).
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_stages).
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = uVar7 >> 2;
  (*pDVar4->_vptr_DeviceInterface[0x20])
            (pDVar4,local_b8,
             (this->m_queryPool).super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.
             m_internal,0,uVar8 & 0xffffffff,uVar7 * 2 & 0x7fffffff8,this->m_timestampValues,8,3);
  pTVar10 = local_c0;
  pdVar2 = this->m_timestampValues;
  for (uVar7 = 0; (uVar8 & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
    pdVar2[uVar7] = pdVar2[uVar7] & uVar9;
  }
  (*(this->super_TestInstance)._vptr_TestInstance[3])(local_c0,this);
LAB_004df23d:
  std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
  ~_Vector_base(&queueProperties.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               );
  return pTVar10;
}

Assistant:

tcu::TestStatus TimestampTestInstance::iterate(void)
{
	const DeviceInterface&      vk          = m_context.getDeviceInterface();
	const VkDevice              vkDevice    = m_context.getDevice();
	const VkQueue               queue       = m_context.getUniversalQueue();

	configCommandBuffer();

	VK_CHECK(vk.resetFences(vkDevice, 1u, &m_fence.get()));

	const VkSubmitInfo          submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,                      // VkStructureType         sType;
		DE_NULL,                                            // const void*             pNext;
		0u,                                                 // deUint32                waitSemaphoreCount;
		DE_NULL,                                            // const VkSemaphore*      pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,                                                 // deUint32                commandBufferCount;
		&m_cmdBuffer.get(),                                 // const VkCommandBuffer*  pCommandBuffers;
		0u,                                                 // deUint32                signalSemaphoreCount;
		DE_NULL,                                            // const VkSemaphore*      pSignalSemaphores;
	};
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *m_fence));

	VK_CHECK(vk.waitForFences(vkDevice, 1u, &m_fence.get(), true, ~(0ull) /* infinity*/));

	// Generate the timestamp mask
	deUint64                    timestampMask;
	const std::vector<VkQueueFamilyProperties>   queueProperties = vk::getPhysicalDeviceQueueFamilyProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice());
	if(queueProperties[0].timestampValidBits == 0)
	{
		return tcu::TestStatus::fail("Device does not support timestamp!");
	}
	else if(queueProperties[0].timestampValidBits == 64)
	{
		timestampMask = 0xFFFFFFFFFFFFFFFF;
	}
	else
	{
		timestampMask = ((deUint64)1 << queueProperties[0].timestampValidBits) - 1;
	}

	// Get timestamp value from query pool
	deUint32                    stageSize = (deUint32)m_stages.size();

	vk.getQueryPoolResults(vkDevice, *m_queryPool, 0u, stageSize, sizeof(deUint64) * stageSize, (void*)m_timestampValues, sizeof(deUint64), VK_QUERY_RESULT_64_BIT | VK_QUERY_RESULT_WAIT_BIT);

	for (deUint32 ndx = 0; ndx < stageSize; ndx++)
	{
		m_timestampValues[ndx] &= timestampMask;
	}

	return verifyTimestamp();
}